

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<long_double>_>::SymbolicAddKel
          (TPZFrontSym<std::complex<long_double>_> *this,TPZVec<long> *destinationindex)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = destinationindex->fNElements;
  if (lVar2 < 1) {
    lVar4 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  }
  else {
    lVar5 = 0;
    do {
      Local(this,destinationindex->fStore[lVar5]);
      lVar4 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
              fNElements;
      (this->super_TPZFront<std::complex<long_double>_>).fFront = lVar4;
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  iVar1 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront;
  iVar3 = (int)lVar4;
  if (lVar4 < iVar1) {
    iVar3 = iVar1;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fMaxFront = iVar3;
  return;
}

Assistant:

void TPZFrontSym<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		this->fFront = this->fGlobal.NElements();
	}
	this->fMaxFront=(this->fFront<this->fMaxFront)?this->fMaxFront:this->fFront;
	
}